

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_2780404::
SubpelVarianceTest<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_const_unsigned_char_*)>
::RefTest(SubpelVarianceTest<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_const_unsigned_char_*)>
          *this)

{
  ACMRandom *this_00;
  int iVar1;
  aom_bit_depth_t aVar2;
  long lVar3;
  undefined8 *puVar4;
  int iVar5;
  uint32_t uVar6;
  long lVar7;
  byte bVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  SEARCH_METHODS *pSVar18;
  uint8_t *puVar19;
  uint uVar20;
  int iVar21;
  uint8_t *puVar22;
  long lVar23;
  undefined2 in_FPUControlWord;
  uint16_t in_FPUTagWord;
  undefined8 in_FPUInstructionPointer;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_100;
  char local_f5;
  int local_f4;
  ulong local_f0;
  int local_e4;
  AssertHelper local_e0;
  int local_d4;
  uint32_t var2;
  uint32_t var1;
  uint32_t sse2;
  uint32_t sse1;
  RegisterStateCheckMMX reg_check_mmx;
  uint16_t *sec16;
  uint16_t *src16;
  
  this_00 = &this->rnd_;
  iVar14 = 0;
  do {
    local_e4 = iVar14 * 2;
    local_f0 = 0;
    do {
      if ((this->params_).use_high_bit_depth == false) {
        if (0 < (this->params_).block_size) {
          lVar13 = 0;
          do {
            uVar6 = testing::internal::Random::Generate(&this_00->random_,0x80000000);
            this->src_[lVar13] = (uint8_t)(uVar6 >> 0x17);
            uVar6 = testing::internal::Random::Generate(&this_00->random_,0x80000000);
            this->sec_[lVar13] = (uint8_t)(uVar6 >> 0x17);
            lVar13 = lVar13 + 1;
          } while (lVar13 < (this->params_).block_size);
        }
        if (-1 < (this->params_).width + (this->params_).block_size + (this->params_).height) {
          lVar13 = -1;
          do {
            uVar6 = testing::internal::Random::Generate(&this_00->random_,0x80000000);
            this->ref_[lVar13 + 1] = (uint8_t)(uVar6 >> 0x17);
            lVar13 = lVar13 + 1;
          } while (lVar13 < (long)(this->params_).height +
                            (long)(this->params_).width + (long)(this->params_).block_size);
        }
      }
      else {
        if (0 < (this->params_).block_size) {
          lVar13 = 0;
          do {
            uVar6 = testing::internal::Random::Generate(&this_00->random_,0x80000000);
            *(ushort *)(lVar13 * 2 + (long)this->src_ * 2) =
                 (ushort)(uVar6 >> 0xf) & (ushort)(this->params_).mask;
            uVar6 = testing::internal::Random::Generate(&this_00->random_,0x80000000);
            *(ushort *)(lVar13 * 2 + (long)this->sec_ * 2) =
                 (ushort)(uVar6 >> 0xf) & (ushort)(this->params_).mask;
            lVar13 = lVar13 + 1;
          } while (lVar13 < (this->params_).block_size);
        }
        if (-1 < (this->params_).width + (this->params_).block_size + (this->params_).height) {
          lVar13 = -1;
          do {
            uVar6 = testing::internal::Random::Generate(&this_00->random_,0x80000000);
            *(ushort *)(lVar13 * 2 + 2 + (long)this->ref_ * 2) =
                 (ushort)(uVar6 >> 0xf) & (ushort)(this->params_).mask;
            lVar13 = lVar13 + 1;
          } while (lVar13 < (long)(this->params_).height +
                            (long)(this->params_).width + (long)(this->params_).block_size);
        }
      }
      reg_check_mmx.pre_fpu_env_[0]._0_1_ = (char)in_FPUControlWord;
      reg_check_mmx.pre_fpu_env_._12_4_ = SUB84(in_FPUInstructionPointer,0);
      reg_check_mmx.pre_fpu_env_[8] = (uint16_t)((ulong)in_FPUInstructionPointer >> 0x20);
      iVar1 = (this->params_).width;
      reg_check_mmx.pre_fpu_env_[4] = in_FPUTagWord;
      var1 = (*(this->params_).func)
                       (this->ref_,iVar1 + 1,iVar14,(int)local_f0,this->src_,iVar1,&sse1,this->sec_)
      ;
      libaom_test::RegisterStateCheckMMX::Check(&reg_check_mmx);
      iVar1 = (this->params_).log2width;
      local_f4 = (this->params_).log2height;
      bVar8 = (byte)iVar1;
      if (local_f4 == 0x1f) {
        lVar17 = 0;
        uVar15 = 0;
      }
      else {
        puVar19 = this->ref_;
        uVar16 = 1 << ((byte)local_f4 & 0x1f);
        uVar20 = 1 << (bVar8 & 0x1f);
        local_f5 = (this->params_).use_high_bit_depth;
        iVar5 = (int)local_f0 * 2;
        uVar9 = uVar20;
        if ((int)uVar20 < 2) {
          uVar9 = 1;
        }
        lVar13 = (long)(int)(uVar20 + 1);
        if ((int)uVar16 < 2) {
          uVar16 = 1;
        }
        lVar7 = (long)puVar19 * 2 + 2;
        lVar3 = lVar13 * 2;
        lVar23 = lVar3 + (long)puVar19 * 2 + 2;
        puVar22 = puVar19 + lVar13 + 1;
        puVar19 = puVar19 + 1;
        uVar12 = 0;
        uVar15 = 0;
        lVar17 = 0;
        do {
          if (iVar1 != 0x1f) {
            lVar10 = (long)((int)uVar12 << (bVar8 & 0x1f));
            uVar11 = 0;
            do {
              if ((bool)local_f5 == false) {
                iVar21 = ((int)(((uint)puVar19[uVar11] - (uint)puVar19[uVar11 - 1]) * local_e4 + 8)
                         >> 4) + (uint)puVar19[uVar11 - 1];
                iVar21 = ((int)((((uint)puVar22[uVar11 - 1] - iVar21) +
                                ((int)(((uint)puVar22[uVar11] - (uint)puVar22[uVar11 - 1]) *
                                       local_e4 + 8) >> 4)) * iVar5 + 8) >> 4) +
                         (uint)this->sec_[uVar11 + lVar10] + iVar21;
                uVar20 = (uint)this->src_[uVar11 + lVar10];
              }
              else {
                uVar20 = (uint)*(ushort *)(lVar7 + -2 + uVar11 * 2);
                iVar21 = ((int)((*(ushort *)(lVar7 + uVar11 * 2) - uVar20) * local_e4 + 8) >> 4) +
                         uVar20;
                uVar20 = (uint)*(ushort *)(lVar23 + -2 + uVar11 * 2);
                iVar21 = ((int)(((uVar20 - iVar21) +
                                ((int)((*(ushort *)(lVar23 + uVar11 * 2) - uVar20) * local_e4 + 8)
                                >> 4)) * iVar5 + 8) >> 4) +
                         (uint)*(ushort *)((long)this->sec_ * 2 + lVar10 * 2 + uVar11 * 2) + iVar21;
                uVar20 = (uint)*(ushort *)((long)this->src_ * 2 + lVar10 * 2 + uVar11 * 2);
              }
              iVar21 = (iVar21 + 1 >> 1) - uVar20;
              uVar15 = uVar15 + (uint)(iVar21 * iVar21);
              lVar17 = lVar17 + iVar21;
              uVar11 = uVar11 + 1;
            } while (uVar9 != uVar11);
          }
          uVar12 = uVar12 + 1;
          lVar23 = lVar23 + lVar3;
          lVar7 = lVar7 + lVar3;
          puVar22 = puVar22 + lVar13;
          puVar19 = puVar19 + lVar13;
          local_d4 = iVar1;
        } while (uVar12 != uVar16);
      }
      aVar2 = (this->params_).bit_depth;
      if (aVar2 == AOM_BITS_10) {
        uVar15 = uVar15 + 8 >> 4;
        lVar17 = lVar17 + 2 >> 2;
      }
      else if (aVar2 == AOM_BITS_12) {
        uVar15 = uVar15 + 0x80 >> 8;
        lVar17 = lVar17 + 8 >> 4;
      }
      sse2 = (uint32_t)uVar15;
      var2 = sse2 - (int)((ulong)(lVar17 * lVar17) >> ((byte)local_f4 + bVar8 & 0x3f));
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                ((internal *)&reg_check_mmx,"sse1","sse2",&sse1,&sse2);
      if ((char)reg_check_mmx.pre_fpu_env_[0] == '\0') {
        testing::Message::Message((Message *)&local_100);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_100._M_head_impl + 0x10),"at position ",0xc);
        std::ostream::operator<<(local_100._M_head_impl + 0x10,iVar14);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_100._M_head_impl + 0x10),", ",2);
        std::ostream::operator<<(local_100._M_head_impl + 0x10,(int)local_f0);
        puVar4 = (undefined8 *)
                 CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                          CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
        pSVar18 = "";
        if (puVar4 != (undefined8 *)0x0) {
          pSVar18 = (SEARCH_METHODS *)*puVar4;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_e0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/variance_test.cc"
                   ,0x594,(char *)pSVar18);
        testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_100);
        testing::internal::AssertHelper::~AssertHelper(&local_e0);
        if (local_100._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_100._M_head_impl + 8))();
        }
      }
      puVar4 = (undefined8 *)
               CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                        CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
      if (puVar4 != (undefined8 *)0x0) {
        if ((undefined8 *)*puVar4 != puVar4 + 2) {
          operator_delete((undefined8 *)*puVar4);
        }
        operator_delete(puVar4);
      }
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                ((internal *)&reg_check_mmx,"var1","var2",&var1,&var2);
      if ((char)reg_check_mmx.pre_fpu_env_[0] == '\0') {
        testing::Message::Message((Message *)&local_100);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_100._M_head_impl + 0x10),"at position ",0xc);
        std::ostream::operator<<(local_100._M_head_impl + 0x10,iVar14);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_100._M_head_impl + 0x10),", ",2);
        std::ostream::operator<<(local_100._M_head_impl + 0x10,(int)local_f0);
        puVar4 = (undefined8 *)
                 CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                          CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
        pSVar18 = "";
        if (puVar4 != (undefined8 *)0x0) {
          pSVar18 = (SEARCH_METHODS *)*puVar4;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_e0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/variance_test.cc"
                   ,0x595,(char *)pSVar18);
        testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_100);
        testing::internal::AssertHelper::~AssertHelper(&local_e0);
        if (local_100._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_100._M_head_impl + 8))();
        }
      }
      puVar4 = (undefined8 *)
               CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                        CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
      if (puVar4 != (undefined8 *)0x0) {
        if ((undefined8 *)*puVar4 != puVar4 + 2) {
          operator_delete((undefined8 *)*puVar4);
        }
        operator_delete(puVar4);
      }
      uVar9 = (int)local_f0 + 1;
      local_f0 = (ulong)uVar9;
    } while (uVar9 != 8);
    iVar14 = iVar14 + 1;
  } while (iVar14 != 8);
  return;
}

Assistant:

void SubpelVarianceTest<SubpixAvgVarMxNFunc>::RefTest() {
  for (int x = 0; x < 8; ++x) {
    for (int y = 0; y < 8; ++y) {
      if (!use_high_bit_depth()) {
        for (int j = 0; j < block_size(); j++) {
          src_[j] = rnd_.Rand8();
          sec_[j] = rnd_.Rand8();
        }
        for (int j = 0; j < block_size() + width() + height() + 1; j++) {
          ref_[j] = rnd_.Rand8();
        }
      } else {
        for (int j = 0; j < block_size(); j++) {
          CONVERT_TO_SHORTPTR(src_)[j] = rnd_.Rand16() & mask();
          CONVERT_TO_SHORTPTR(sec_)[j] = rnd_.Rand16() & mask();
        }
        for (int j = 0; j < block_size() + width() + height() + 1; j++) {
          CONVERT_TO_SHORTPTR(ref_)[j] = rnd_.Rand16() & mask();
        }
      }
      uint32_t sse1, sse2;
      uint32_t var1, var2;
      API_REGISTER_STATE_CHECK(var1 = params_.func(ref_, width() + 1, x, y,
                                                   src_, width(), &sse1, sec_));
      var2 = subpel_avg_variance_ref(ref_, src_, sec_, params_.log2width,
                                     params_.log2height, x, y, &sse2,
                                     use_high_bit_depth(), params_.bit_depth);
      EXPECT_EQ(sse1, sse2) << "at position " << x << ", " << y;
      EXPECT_EQ(var1, var2) << "at position " << x << ", " << y;
    }
  }
}